

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O0

Pdr_Set_t * Pdr_ManReduceClause(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Pdr_Set_t *pSet;
  int iVar1;
  int iVar2;
  sat_solver *s;
  int *pLits;
  int *local_50;
  int *pCoreLits;
  int local_40;
  int nCoreLits;
  int Entry;
  int i;
  Vec_Int_t *vLits;
  Pdr_Set_t *pCubeMin;
  Pdr_Set_t *pCube_local;
  Pdr_Man_t *pPStack_18;
  int k_local;
  Pdr_Man_t *p_local;
  
  pCubeMin = pCube;
  pCube_local._4_4_ = k;
  pPStack_18 = p;
  s = Pdr_ManSolver(p,k);
  pCoreLits._4_4_ = sat_solver_final(s,&local_50);
  _Entry = Pdr_ManLitsToCube(pPStack_18,pCube_local._4_4_,local_50,pCoreLits._4_4_);
  iVar1 = Vec_IntSize(_Entry);
  if (iVar1 == pCubeMin->nLits) {
    p_local = (Pdr_Man_t *)0x0;
  }
  else {
    iVar1 = Vec_IntSize(_Entry);
    if (pCubeMin->nLits <= iVar1) {
      __assert_fail("Vec_IntSize(vLits) < pCube->nLits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                    ,0x5e,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
    for (nCoreLits = 0; iVar1 = nCoreLits, iVar2 = Vec_IntSize(_Entry), iVar1 < iVar2;
        nCoreLits = nCoreLits + 1) {
      local_40 = Vec_IntEntry(_Entry,nCoreLits);
      iVar1 = lit_sign(local_40);
      if (iVar1 == 0) break;
    }
    iVar1 = nCoreLits;
    iVar2 = Vec_IntSize(_Entry);
    if (iVar1 == iVar2) {
      for (nCoreLits = 0; nCoreLits < pCubeMin->nLits; nCoreLits = nCoreLits + 1) {
        iVar1 = lit_sign(*(lit *)(&pCubeMin->field_0x14 + (long)nCoreLits * 4));
        if (iVar1 == 0) {
          Vec_IntPush(_Entry,*(int *)(&pCubeMin->field_0x14 + (long)nCoreLits * 4));
          break;
        }
      }
      if (pCubeMin->nLits <= nCoreLits) {
        __assert_fail("i < pCube->nLits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                      ,0x6c,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
      }
    }
    pSet = pCubeMin;
    pLits = Vec_IntArray(_Entry);
    iVar1 = Vec_IntSize(_Entry);
    vLits = (Vec_Int_t *)Pdr_SetCreateSubset(pSet,pLits,iVar1);
    iVar1 = Pdr_SetIsInit((Pdr_Set_t *)vLits,-1);
    if (iVar1 != 0) {
      __assert_fail("!Pdr_SetIsInit(pCubeMin, -1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                    ,0x70,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
    p_local = (Pdr_Man_t *)vLits;
  }
  return (Pdr_Set_t *)p_local;
}

Assistant:

Pdr_Set_t * Pdr_ManReduceClause( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pCubeMin;
    Vec_Int_t * vLits;
    int i, Entry, nCoreLits, * pCoreLits;
    // get relevant SAT literals
    nCoreLits = sat_solver_final(Pdr_ManSolver(p, k), &pCoreLits);
    // translate them into register literals and remove auxiliary
    vLits = Pdr_ManLitsToCube( p, k, pCoreLits, nCoreLits );
    // skip if there is no improvement
    if ( Vec_IntSize(vLits) == pCube->nLits )
        return NULL;
    assert( Vec_IntSize(vLits) < pCube->nLits );
    // if the cube overlaps with init, add any literal
    Vec_IntForEachEntry( vLits, Entry, i )
        if ( lit_sign(Entry) == 0 ) // positive literal
            break;
    if ( i == Vec_IntSize(vLits) ) // only negative literals
    {
        // add the first positive literal
        for ( i = 0; i < pCube->nLits; i++ )
            if ( lit_sign(pCube->Lits[i]) == 0 ) // positive literal
            {
                Vec_IntPush( vLits, pCube->Lits[i] );
                break;
            }
        assert( i < pCube->nLits );
    }
    // generate a starting cube
    pCubeMin  = Pdr_SetCreateSubset( pCube, Vec_IntArray(vLits), Vec_IntSize(vLits) );
    assert( !Pdr_SetIsInit(pCubeMin, -1) );
/*
    // make sure the cube works
    {
    int RetValue;
    RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, 0 );
    assert( RetValue );
    }
*/
    return pCubeMin;
}